

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week9-hw.cpp
# Opt level: O0

vector<Student,_std::allocator<Student>_> *
filter<std::vector<Student,std::allocator<Student>>,main::__1>
          (vector<Student,_std::allocator<Student>_> *__return_storage_ptr__,pointer container)

{
  pointer this;
  bool bVar1;
  reference s;
  Student *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Student,_std::allocator<Student>_> *__range1;
  vector<Student,_std::allocator<Student>_> c;
  vector<Student,_std::allocator<Student>_> *container_local;
  vector<Student,_std::allocator<Student>_> *local_10;
  
  c.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = container;
  local_10 = __return_storage_ptr__;
  memset(&__range1,0,0x18);
  std::vector<Student,_std::allocator<Student>_>::vector
            ((vector<Student,_std::allocator<Student>_> *)&__range1);
  this = c.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  __end0 = std::vector<Student,_std::allocator<Student>_>::begin
                     ((vector<Student,_std::allocator<Student>_> *)
                      c.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  item = (Student *)
         std::vector<Student,_std::allocator<Student>_>::end
                   ((vector<Student,_std::allocator<Student>_> *)this);
  while (bVar1 = __gnu_cxx::
                 operator==<const_Student_*,_std::vector<Student,_std::allocator<Student>_>_>
                           (&__end0,(__normal_iterator<const_Student_*,_std::vector<Student,_std::allocator<Student>_>_>
                                     *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
    s = __gnu_cxx::
        __normal_iterator<const_Student_*,_std::vector<Student,_std::allocator<Student>_>_>::
        operator*(&__end0);
    bVar1 = main::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&container_local + 7),s);
    if (bVar1) {
      std::vector<Student,_std::allocator<Student>_>::push_back
                ((vector<Student,_std::allocator<Student>_> *)&__range1,s);
    }
    __gnu_cxx::__normal_iterator<const_Student_*,_std::vector<Student,_std::allocator<Student>_>_>::
    operator++(&__end0);
  }
  std::vector<Student,_std::allocator<Student>_>::vector
            (__return_storage_ptr__,(vector<Student,_std::allocator<Student>_> *)&__range1);
  std::vector<Student,_std::allocator<Student>_>::~vector
            ((vector<Student,_std::allocator<Student>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

auto filter(const Container& container, auto func)
{
    auto c = Container();
    for(const auto& item : container)
        if(func(item))
            c.push_back(item);
    return c;
}